

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

void __thiscall Indexing::ClauseCodeTree::ClauseMatcher::leaveLiteral(ClauseMatcher *this)

{
  bool bVar1;
  ILStruct *pIVar2;
  size_t sVar3;
  long in_RDI;
  uint depth;
  ILStruct *ils;
  LiteralMatcher *prevLM;
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  *in_stack_ffffffffffffffe8;
  
  Lib::
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  ::pop(in_stack_ffffffffffffffe8);
  Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
             *)ils);
  bVar1 = Lib::
          Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
          ::isNonEmpty((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                        *)(in_RDI + 0x30));
  if (bVar1) {
    Lib::
    Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
    ::top((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
           *)(in_RDI + 0x30));
    Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                 *)0x2f71c2);
    pIVar2 = CodeTree::CodeOp::getILS((CodeOp *)0x2f71d4);
    pIVar2->finished = true;
    if (((*(byte *)(in_RDI + 0x10) & 1) != 0) &&
       (sVar3 = Lib::
                Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                ::size((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                        *)(in_RDI + 0x30)), *(int *)(in_RDI + 0x14) == (int)sVar3 + -1)) {
      *(undefined4 *)(in_RDI + 0x14) = 0xffffffff;
    }
  }
  return;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::leaveLiteral()
{
  ASS(lms.isNonEmpty());

  lms.pop();

  if(lms.isNonEmpty()) {
    LiteralMatcher* prevLM = &*lms.top();
    ILStruct* ils=prevLM->op->getILS();
    ASS_EQ(ils->timestamp,tree->_curTimeStamp);
    ASS(ils->visited);

    ils->finished=true;

    if(sres) {
      //clear the resolved literal flag if we have backtracked from it
      unsigned depth=lms.size()-1;
      if(sresLiteral==depth) {
        sresLiteral=sresNoLiteral;
      }
      ASS(sresLiteral==sresNoLiteral || sresLiteral<depth);
    }
  }
}